

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

QRect __thiscall QMenuBarPrivate::menuRect(QMenuBarPrivate *this,bool extVisible)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  Data *pDVar4;
  uint uVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  QStyle *pQVar9;
  int iVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  int iVar12;
  QRect QVar13;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar9 = QWidget::style(this_00);
  uVar5 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x21,0,this_00);
  uVar11 = (ulong)uVar5;
  pQVar3 = this_00->data;
  iVar1 = (pQVar3->crect).y1.m_i;
  iVar2 = (pQVar3->crect).y2.m_i;
  iVar12 = (pQVar3->crect).x2.m_i - ((pQVar3->crect).x1.m_i + uVar5);
  if ((int)CONCAT71(in_register_00000031,extVisible) != 0) {
    LVar6 = QWidget::layoutDirection(this_00);
    iVar7 = (**(code **)(*(long *)&(this->extension->super_QToolButton).super_QAbstractButton.
                                   super_QWidget + 0x70))();
    if (LVar6 == RightToLeft) {
      uVar11 = (ulong)(uVar5 + iVar7);
    }
    else {
      iVar12 = iVar12 - iVar7;
    }
  }
  pDVar4 = (this->leftWidget).wp.d;
  if ((((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
      ((this->leftWidget).wp.value != (QObject *)0x0)) &&
     ((*(byte *)(*(long *)((this->leftWidget).wp.value + 0x20) + 9) & 0x80) != 0)) {
    iVar7 = (**(code **)(*(long *)(this->leftWidget).wp.value + 0x70))();
    LVar6 = QWidget::layoutDirection(this_00);
    iVar10 = 0;
    if (LVar6 == RightToLeft) {
      iVar10 = iVar7;
      iVar7 = 0;
    }
    uVar11 = (ulong)(uint)((int)uVar11 + iVar7);
    iVar12 = iVar12 - iVar10;
  }
  pDVar4 = (this->rightWidget).wp.d;
  if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
     (((this->rightWidget).wp.value != (QObject *)0x0 &&
      ((*(byte *)(*(long *)((this->rightWidget).wp.value + 0x20) + 9) & 0x80) != 0)))) {
    iVar8 = (**(code **)(*(long *)(this->rightWidget).wp.value + 0x70))();
    LVar6 = QWidget::layoutDirection(this_00);
    iVar10 = iVar8;
    iVar7 = 0;
    if (LVar6 == RightToLeft) {
      iVar10 = 0;
      iVar7 = iVar8;
    }
    uVar11 = (ulong)(uint)((int)uVar11 + iVar7);
    iVar12 = iVar12 - iVar10;
  }
  QVar13.y2.m_i = iVar2 - iVar1;
  QVar13.x2.m_i = iVar12;
  QVar13.x1.m_i = (int)uVar11;
  QVar13.y1.m_i = (int)(uVar11 >> 0x20);
  return QVar13;
}

Assistant:

QRect QMenuBarPrivate::menuRect(bool extVisible) const
{
    Q_Q(const QMenuBar);

    int hmargin = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    QRect result = q->rect();
    result.adjust(hmargin, 0, -hmargin, 0);

    if (extVisible) {
        if (q->isRightToLeft())
            result.setLeft(result.left() + extension->sizeHint().width());
        else
            result.setWidth(result.width() - extension->sizeHint().width());
    }

    if (leftWidget && leftWidget->isVisible()) {
        QSize sz = leftWidget->sizeHint();
        if (q->isRightToLeft())
            result.setRight(result.right() - sz.width());
        else
            result.setLeft(result.left() + sz.width());
    }

    if (rightWidget && rightWidget->isVisible()) {
        QSize sz = rightWidget->sizeHint();
        if (q->isRightToLeft())
            result.setLeft(result.left() + sz.width());
        else
            result.setRight(result.right() - sz.width());
    }

    return result;
}